

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O1

void leopard::ff16::FWHT(ffe_t *data,uint m,uint m_truncated)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ushort *puVar15;
  long lVar16;
  
  uVar8 = 4;
  uVar4 = 1;
  do {
    uVar5 = uVar8;
    if (0 < (int)m) {
      uVar11 = (ulong)uVar4;
      iVar12 = 0;
      uVar8 = uVar4;
      do {
        if (iVar12 < (int)(uVar4 + iVar12)) {
          puVar15 = data + iVar12;
          lVar16 = (long)(int)uVar8 - (long)iVar12;
          do {
            uVar3 = *(ushort *)((long)puVar15 + (ulong)(uVar4 * 2));
            uVar9 = (uint)uVar3 + (uint)*puVar15;
            uVar6 = (uint)*puVar15 - (uint)uVar3;
            uVar7 = (uint)puVar15[uVar11 * 3] + (uint)puVar15[uVar11 * 2];
            uVar10 = (uint)puVar15[uVar11 * 2] - (uint)puVar15[uVar11 * 3];
            uVar9 = (uVar9 >> 0x10) + uVar9 & 0xffff;
            uVar7 = (uVar7 >> 0x10) + uVar7 & 0xffff;
            iVar1 = uVar7 + uVar9;
            iVar14 = uVar9 - uVar7;
            uVar7 = (uVar6 >> 0x10) + uVar6 & 0xffff;
            uVar6 = (uVar10 >> 0x10) + uVar10 & 0xffff;
            iVar2 = uVar6 + uVar7;
            iVar13 = uVar7 - uVar6;
            *puVar15 = (short)((uint)iVar1 >> 0x10) + (short)iVar1;
            *(short *)((long)puVar15 + (ulong)(uVar4 * 2)) =
                 (short)((uint)iVar2 >> 0x10) + (short)iVar2;
            puVar15[uVar11 * 2] = (short)((uint)iVar14 >> 0x10) + (short)iVar14;
            puVar15[uVar11 * 3] = (short)((uint)iVar13 >> 0x10) + (short)iVar13;
            puVar15 = puVar15 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        iVar12 = iVar12 + uVar5;
        uVar8 = uVar8 + uVar5;
      } while (iVar12 < (int)m);
    }
    uVar8 = uVar5 * 4;
    uVar4 = uVar5;
  } while (uVar5 < 0x4001);
  return;
}

Assistant:

static void FWHT(ffe_t* data, const unsigned m, const unsigned m_truncated)
{
    // Decimation in time: Unroll 2 layers at a time
    unsigned dist = 1, dist4 = 4;
    for (; dist4 <= m; dist = dist4, dist4 <<= 2)
    {
        // For each set of dist*4 elements:
#pragma omp parallel for
        for (int r = 0; r < (int)m_truncated; r += dist4)
        {
            // For each set of dist elements:
            const int i_end = r + dist;
            for (int i = r; i < i_end; ++i)
                FWHT_4(data + i, dist);
        }
    }

    // If there is one layer left:
    if (dist < m)
#pragma omp parallel for
        for (int i = 0; i < (int)dist; ++i)
            FWHT_2(data[i], data[i + dist]);
}